

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O0

void ovf::detail::parse::v2::ovf_segment_header_action<ovf::detail::parse::v2::segment_header>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *file,ovf_segment *segment)

{
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  parse_error *this;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  int local_40c;
  undefined1 local_408 [4];
  int i;
  string message;
  value_type local_3e0;
  allocator local_3b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  allocator local_391;
  value_type local_390;
  allocator local_369;
  value_type local_368;
  allocator local_341;
  value_type local_340;
  allocator local_319;
  value_type local_318;
  allocator local_2f1;
  value_type local_2f0;
  allocator local_2c9;
  value_type local_2c8;
  allocator local_2a1;
  value_type local_2a0;
  allocator local_279;
  value_type local_278;
  allocator local_251;
  value_type local_250;
  allocator local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  allocator local_201;
  value_type local_200;
  allocator local_1d9;
  value_type local_1d8;
  allocator local_1b1;
  value_type local_1b0;
  allocator local_189;
  value_type local_188;
  allocator local_161;
  value_type local_160;
  allocator local_139;
  value_type local_138;
  allocator local_111;
  value_type local_110;
  allocator local_e9;
  value_type local_e8;
  allocator local_c1;
  value_type local_c0;
  allocator local_99;
  value_type local_98;
  allocator local_71;
  value_type local_70;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_39;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missing_keywords;
  ovf_segment *segment_local;
  ovf_file *file_local;
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  
  missing_keywords.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)segment;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_39);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38,0,&local_39);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_39);
  if ((file->_state->found_title & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"title",&local_71);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  if ((file->_state->found_meshunit & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"meshunit",&local_99);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  if ((file->_state->found_valueunits & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"valueunits",&local_c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  if ((file->_state->found_valuelabels & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"valuelabels",&local_e9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  if ((file->_state->found_xmin & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"xmin",&local_111);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  if ((file->_state->found_ymin & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"ymin",&local_139);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  if ((file->_state->found_zmin & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"zmin",&local_161);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
  }
  if ((file->_state->found_xmax & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,"xmax",&local_189);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
  }
  if ((file->_state->found_ymax & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b0,"ymax",&local_1b1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  if ((file->_state->found_zmax & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,"zmax",&local_1d9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  if ((file->_state->found_meshtype & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_200,"meshtype",&local_201);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  pcVar1 = (char *)missing_keywords.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage[1]._M_string_length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,pcVar1,&local_229);
  bVar2 = std::operator==(&local_228,"rectangular");
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  if (bVar2) {
    uVar6 = *(int *)((long)&missing_keywords.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage[1].field_2 + 0xc) *
            *(int *)(missing_keywords.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) *
            *(int *)&missing_keywords.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[2].field_0x4;
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar6;
    *(uint *)&missing_keywords.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[2]._M_string_length = uVar6;
    if ((file->_state->found_xbase & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_250,"xbase",&local_251);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
    }
    if ((file->_state->found_ybase & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_278,"ybase",&local_279);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
    }
    if ((file->_state->found_zbase & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2a0,"zbase",&local_2a1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    }
    if ((file->_state->found_xstepsize & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2c8,"xstepsize",&local_2c9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    }
    if ((file->_state->found_ystepsize & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2f0,"ystepsize",&local_2f1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    }
    if ((file->_state->found_zstepsize & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_318,"zstepsize",&local_319);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
    }
    if ((file->_state->found_xnodes & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_340,"xnodes",&local_341);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
    }
    if ((file->_state->found_ynodes & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_368,"ynodes",&local_369);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
    }
    if ((file->_state->found_znodes & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_390,"znodes",&local_391);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
    }
  }
  else {
    pcVar1 = (char *)missing_keywords.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[1]._M_string_length;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b8,pcVar1,&local_3b9);
    bVar2 = std::operator==(&local_3b8,"irregular");
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    if (bVar2) {
      uVar6 = *(uint *)((long)&missing_keywords.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage[1].field_2 + 8);
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar6;
      *(uint *)&missing_keywords.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[2]._M_string_length = uVar6;
      if ((file->_state->found_pointcount & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_3e0,"pointcount",
                   (allocator *)(message.field_2._M_local_buf + 0xf));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
      }
    }
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38);
  if (sVar3 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
    return;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,0);
  fmt::v5::format<char[23],std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
             (v5 *)"Missing keywords: \"{}\"",(char (*) [23])pvVar4,in_RCX);
  for (local_40c = 1;
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_40c,
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38), pbVar5 < args; local_40c = local_40c + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,(long)local_40c);
    fmt::v5::format<char[7],std::__cxx11::string>
              (&local_430,(v5 *)", \"{}\"",(char (*) [7])pvVar4,args);
    std::__cxx11::string::operator+=((string *)local_408,(string *)&local_430);
    std::__cxx11::string::~string((string *)&local_430);
  }
  this = (parse_error *)__cxa_allocate_exception(0x28);
  tao::pegtl::parse_error::
  parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
            (this,(string *)local_408,in);
  __cxa_throw(this,&tao::pegtl::parse_error::typeinfo,tao::pegtl::parse_error::~parse_error);
}

Assistant:

static void apply( const Input& in, ovf_file & file, ovf_segment & segment )
            {
                // Check if all required keywords were present
                std::vector<std::string> missing_keywords(0);
                if( !file._state->found_title )
                    missing_keywords.push_back("title");
                if( !file._state->found_meshunit )
                    missing_keywords.push_back("meshunit");
                if( !file._state->found_valueunits )
                    missing_keywords.push_back("valueunits");
                if( !file._state->found_valuelabels )
                    missing_keywords.push_back("valuelabels");
                if( !file._state->found_xmin )
                    missing_keywords.push_back("xmin");
                if( !file._state->found_ymin )
                    missing_keywords.push_back("ymin");
                if( !file._state->found_zmin )
                    missing_keywords.push_back("zmin");
                if( !file._state->found_xmax )
                    missing_keywords.push_back("xmax");
                if( !file._state->found_ymax )
                    missing_keywords.push_back("ymax");
                if( !file._state->found_zmax )
                    missing_keywords.push_back("zmax");
                if( !file._state->found_meshtype )
                    missing_keywords.push_back("meshtype");

                if( std::string(segment.meshtype) == "rectangular" )
                {
                    segment.N = segment.n_cells[0] * segment.n_cells[1] * segment.n_cells[2];

                    if( !file._state->found_xbase )
                        missing_keywords.push_back("xbase");
                    if( !file._state->found_ybase )
                        missing_keywords.push_back("ybase");
                    if( !file._state->found_zbase )
                        missing_keywords.push_back("zbase");
                    if( !file._state->found_xstepsize )
                        missing_keywords.push_back("xstepsize");
                    if( !file._state->found_ystepsize )
                        missing_keywords.push_back("ystepsize");
                    if( !file._state->found_zstepsize )
                        missing_keywords.push_back("zstepsize");
                    if( !file._state->found_xnodes )
                        missing_keywords.push_back("xnodes");
                    if( !file._state->found_ynodes )
                        missing_keywords.push_back("ynodes");
                    if( !file._state->found_znodes )
                        missing_keywords.push_back("znodes");
                }
                else if( std::string(segment.meshtype) == "irregular" )
                {
                    segment.N = segment.pointcount;

                    if( !file._state->found_pointcount )
                        missing_keywords.push_back("pointcount");
                }

                if( missing_keywords.size() > 0 )
                {
                    std::string message = fmt::format( "Missing keywords: \"{}\"", missing_keywords[0] );
                    for( int i=1; i < missing_keywords.size(); ++i )
                        message += fmt::format( ", \"{}\"", missing_keywords[i] );
                    throw tao::pegtl::parse_error( message, in );
                }
            }